

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimeProfileInfo.cpp
# Opt level: O3

void JITTimeProfileInfo::InitializeJITProfileData
               (ArenaAllocator *alloc,DynamicProfileInfo *profileInfo,FunctionBody *functionBody,
               ProfileDataIDL *data,bool isForegroundJIT)

{
  ushort uVar1;
  Type TVar2;
  ArrayCallSiteIDL *pAVar3;
  FldInfo *pFVar4;
  SListNodeBase<Memory::Recycler> *pSVar5;
  code *pcVar6;
  size_t requestedBytes;
  SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *pSVar7;
  bool bVar8;
  ImplicitCallFlags IVar9;
  unsigned_short uVar10;
  uint32 uVar11;
  ThisInfo TVar12;
  BOOL BVar13;
  uint uVar14;
  StElemIDL *dst;
  SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *pSVar15;
  undefined4 *puVar16;
  CallbackInfoIDL *__s;
  Type *pTVar17;
  LdLenIDL *dst_00;
  ulong uVar18;
  LdElemIDL *dst_01;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar19;
  Iterator local_58;
  FunctionBody *local_48;
  Type local_40;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *local_38;
  
  if (profileInfo != (DynamicProfileInfo *)0x0) {
    uVar14._0_2_ = functionBody->profiledLdLenCount;
    uVar14._2_2_ = functionBody->profiledLdElemCount;
    data->profiledLdLenCount = (undefined2)uVar14;
    data->profiledLdElemCount = uVar14._2_2_;
    data->profiledStElemCount = functionBody->profiledStElemCount;
    local_38 = &alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    if (isForegroundJIT) {
      data->ldLenData = (LdLenIDL *)(profileInfo->ldLenInfo).ptr;
      data->ldElemData = (LdElemIDL *)(profileInfo->ldElemInfo).ptr;
      data->stElemData = (StElemIDL *)(profileInfo->stElemInfo).ptr;
    }
    else {
      dst_01 = (LdElemIDL *)&DAT_00000008;
      dst_00 = (LdLenIDL *)&DAT_00000008;
      if ((undefined2)uVar14 != 0) {
        BVar13 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar13 == 0) {
          AssertCount = AssertCount + 1;
          local_48 = functionBody;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar8) goto LAB_0056be6c;
          *puVar16 = 0;
          functionBody = local_48;
        }
        dst_00 = (LdLenIDL *)
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal(local_38,(ulong)((uVar14 & 0xffff) << 2));
        if (dst_00 == (LdLenIDL *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar8) goto LAB_0056be6c;
          *puVar16 = 0;
          dst_00 = (LdLenIDL *)0x0;
        }
      }
      data->ldLenData = dst_00;
      memcpy_s(dst_00,(ulong)data->profiledLdLenCount << 2,(profileInfo->ldLenInfo).ptr,
               (ulong)functionBody->profiledLdLenCount << 2);
      uVar1 = data->profiledLdElemCount;
      if (uVar1 != 0) {
        BVar13 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar13 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar8) goto LAB_0056be6c;
          *puVar16 = 0;
        }
        dst_01 = (LdElemIDL *)
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal(local_38,(ulong)((uint)uVar1 * 2) * 3);
        if (dst_01 == (LdElemIDL *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar8) goto LAB_0056be6c;
          *puVar16 = 0;
          dst_01 = (LdElemIDL *)0x0;
        }
      }
      data->ldElemData = dst_01;
      memcpy_s(dst_01,(ulong)((uint)data->profiledLdElemCount * 2) * 3,(profileInfo->ldElemInfo).ptr
               ,(ulong)((uint)functionBody->profiledLdElemCount * 2) * 3);
      uVar1 = data->profiledStElemCount;
      if (uVar1 == 0) {
        dst = (StElemIDL *)&DAT_00000008;
      }
      else {
        BVar13 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar13 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar8) goto LAB_0056be6c;
          *puVar16 = 0;
        }
        dst = (StElemIDL *)
              Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              AllocInternal(local_38,(ulong)uVar1 << 2);
        if (dst == (StElemIDL *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar8) goto LAB_0056be6c;
          *puVar16 = 0;
          dst = (StElemIDL *)0x0;
        }
      }
      data->stElemData = dst;
      memcpy_s(dst,(ulong)data->profiledStElemCount << 2,(profileInfo->stElemInfo).ptr,
               (ulong)functionBody->profiledStElemCount << 2);
    }
    data->profiledArrayCallSiteCount = functionBody->profiledArrayCallSiteCount;
    pAVar3 = (ArrayCallSiteIDL *)(profileInfo->arrayCallSiteInfo).ptr;
    data->arrayCallSiteData = pAVar3;
    data->arrayCallSiteDataAddr = (long)pAVar3;
    uVar11 = Js::FunctionBody::GetCountField(functionBody,InlineCacheCount);
    data->inlineCacheCount = uVar11;
    pFVar4 = (profileInfo->fldInfo).ptr;
    data->fldData = (FldIDL *)pFVar4;
    data->fldDataAddr = (long)pFVar4;
    TVar12 = Js::DynamicProfileInfo::GetThisInfo(profileInfo);
    (data->thisData).valueType = (unsigned_short)TVar12.valueType.field_0.field_0;
    (data->thisData).thisType = TVar12.thisType;
    data->profiledCallSiteCount = functionBody->profiledCallSiteCount;
    data->callSiteData = (CallSiteIDL *)(profileInfo->callSiteInfo).ptr;
    pSVar15 = (SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *)
              Js::FunctionProxy::GetAuxPtrWithLock
                        ((FunctionProxy *)functionBody,CallbackArgOutInfoList);
    if (pSVar15 == (SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
      data->profiledCallbackCount = 0;
    }
    else {
      uVar14 = (pSVar15->super_RealCount).count;
      data->profiledCallbackCount = (unsigned_short)uVar14;
      if ((uVar14 & 0xffff) != 0) {
        local_48 = functionBody;
        BVar13 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar13 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar8) goto LAB_0056be6c;
          *puVar16 = 0;
        }
        uVar18 = (ulong)((uVar14 & 0xffff) << 2);
        requestedBytes = uVar18 * 3;
        __s = (CallbackInfoIDL *)
              Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              AllocInternal(local_38,requestedBytes);
        memset(__s,0,requestedBytes);
        memset(&__s->argInfoButs + requestedBytes,0,
               (ulong)((int)requestedBytes + 0xfU & 0xfffffff0) + uVar18 * -3);
        if (__s == (CallbackInfoIDL *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar8) {
LAB_0056be6c:
            pcVar6 = (code *)invalidInstructionException();
            (*pcVar6)();
          }
          *puVar16 = 0;
        }
        data->callbackData = __s;
        functionBody = local_48;
        local_58.list = pSVar15;
        local_58.current = (NodeBase *)pSVar15;
        if (data->profiledCallbackCount != 0) {
          uVar18 = 1;
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          pAVar19 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)0x0;
          while( true ) {
            if (pSVar15 == (SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar16 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                 ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar8) goto LAB_0056be6c;
              *puVar16 = 0;
              pSVar15 = (SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *)
                        local_58.current;
            }
            pSVar7 = local_58.list;
            pSVar5 = (pSVar15->super_SListNodeBase<Memory::Recycler>).next.ptr;
            local_38 = pAVar19;
            Memory::Recycler::WBSetBit((char *)&local_40);
            local_40.ptr = pSVar5;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40);
            if ((SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *)local_40.ptr == pSVar7
               ) {
              local_58.current = (NodeBase *)0x0;
            }
            else {
              pSVar5 = (((SListNodeBase<Memory::Recycler> *)&(local_58.current)->next)->next).ptr;
              Memory::Recycler::WBSetBit((char *)&local_40);
              local_40.ptr = pSVar5;
              Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40);
              local_58.current = local_40.ptr;
            }
            pTVar17 = SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount>::Iterator::Data
                                (&local_58);
            pAVar19 = local_38;
            memcpy_s(&data->callbackData->argInfoButs +
                     (long)&((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            &local_38->super_Allocator)->super_Allocator,0xc,pTVar17->ptr,0xc);
            functionBody = local_48;
            if (data->profiledCallbackCount <= uVar18) break;
            pAVar19 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                      ((long)&(((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 *)&pAVar19->super_Allocator)->super_Allocator).recoverMemoryFunc +
                      4);
            uVar18 = uVar18 + 1;
            pSVar15 = (SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *)local_58.current
            ;
          }
        }
      }
    }
    data->loopFlags = (BVFixedIDL *)(profileInfo->loopFlags).ptr;
    data->profiledSlotCount = functionBody->profiledSlotCount;
    data->slotData = (unsigned_short *)(profileInfo->slotInfo).ptr;
    data->profiledReturnTypeCount = functionBody->profiledReturnTypeCount;
    data->returnTypeData = (unsigned_short *)(profileInfo->returnTypeInfo).ptr;
    data->divideTypeInfo = (unsigned_short *)(profileInfo->divideTypeInfo).ptr;
    TVar2 = functionBody->profiledSwitchCount;
    data->profiledDivOrRemCount = functionBody->profiledDivOrRemCount;
    data->profiledSwitchCount = TVar2;
    data->switchTypeInfo = (unsigned_short *)(profileInfo->switchTypeInfo).ptr;
    TVar2 = (functionBody->super_ParseableFunctionInfo).m_inParamCount;
    uVar10 = TVar2 - 1;
    if (TVar2 == 0) {
      uVar10 = 0;
    }
    data->profiledInParamsCount = uVar10;
    data->parameterInfo = (unsigned_short *)(profileInfo->parameterInfo).ptr;
    uVar11 = Js::FunctionBody::GetCountField(functionBody,LoopCount);
    data->loopCount = uVar11;
    data->loopImplicitCallFlags = (profileInfo->loopImplicitCallFlags).ptr;
    IVar9 = Js::DynamicProfileInfo::GetImplicitCallFlags(profileInfo);
    data->implicitCallFlags = IVar9;
    data->flags = 0;
    uVar14 = *(uint *)&profileInfo->bits & 1;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits & 2 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits & 4 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits & 8 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits & 0x10 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits & 0x20 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits & 0x40 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits >> 1 & 0x80 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits >> 1 & 0x100 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits >> 2 & 0x200 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits >> 2 & 0x400 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits >> 2 & 0x800 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits >> 2 & 0x1000 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits >> 2 & 0x2000 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits >> 2 & 0x4000 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits >> 2 & 0x8000 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits >> 2 & 0x10000 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits >> 2 & 0x20000 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits >> 2 & 0x40000 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits >> 2 & 0x80000 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits >> 2 & 0x100000 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits >> 2 & 0x200000 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits >> 2 & 0x400000 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits >> 2 & 0x800000 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits >> 4 & 0x1000000 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits >> 4 & 0x2000000 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits >> 4 & 0x4000000 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = *(uint *)&profileInfo->bits >> 4 & 0x8000000 | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = ((byte)(profileInfo->bits).field_0x4 & 1) << 0x1c | uVar14;
    data->flags = (ulong)uVar14;
    uVar14 = (*(uint *)&profileInfo->bits & 0x80) << 0x16 | uVar14;
    data->flags = (ulong)uVar14;
    data->flags = (ulong)((*(uint *)&profileInfo->bits & 0x400) << 0x14 | uVar14);
    bVar8 = Js::DynamicProfileInfo::HasLdFldCallSiteInfo(profileInfo);
    uVar18 = (ulong)((uint)bVar8 << 0x1f) | data->flags;
    data->flags = uVar18;
    uVar18 = (ulong)((byte)(profileInfo->bits).field_0x4 & 8) << 0x1d | uVar18;
    data->flags = uVar18;
    uVar18 = (ulong)((byte)(profileInfo->bits).field_0x4 & 4) << 0x1f | uVar18;
    data->flags = uVar18;
    uVar18 = (ulong)((byte)(profileInfo->bits).field_0x4 & 2) << 0x21 | uVar18;
    data->flags = uVar18;
    uVar14 = (byte)(profileInfo->bits).field_0x4 & 0x10;
    data->flags = (ulong)uVar14 << 0x1f | uVar18;
    uVar14 = (byte)(profileInfo->bits).field_0x4 & 0x20 | uVar14;
    data->flags = (ulong)uVar14 << 0x1f | uVar18;
    data->flags = (ulong)((byte)(profileInfo->bits).field_0x4 & 0x40 | uVar14) << 0x1f | uVar18;
  }
  return;
}

Assistant:

void
JITTimeProfileInfo::InitializeJITProfileData(
    __in ArenaAllocator * alloc,
    __in Js::DynamicProfileInfo * profileInfo,
    __in Js::FunctionBody *functionBody,
    __out ProfileDataIDL * data,
    bool isForegroundJIT)
{
    if (profileInfo == nullptr)
    {
        return;
    }

    CompileAssert(sizeof(LdLenIDL) == sizeof(Js::LdLenInfo));
    CompileAssert(sizeof(LdElemIDL) == sizeof(Js::LdElemInfo));
    CompileAssert(sizeof(StElemIDL) == sizeof(Js::StElemInfo));

    data->profiledLdLenCount = functionBody->GetProfiledLdLenCount();
    data->profiledLdElemCount = functionBody->GetProfiledLdElemCount();
    data->profiledStElemCount = functionBody->GetProfiledStElemCount();

    if (JITManager::GetJITManager()->IsOOPJITEnabled() || isForegroundJIT)
    {
        data->ldLenData = (LdLenIDL*)profileInfo->GetLdLenInfo();
        data->ldElemData = (LdElemIDL*)profileInfo->GetLdElemInfo();
        data->stElemData = (StElemIDL*)profileInfo->GetStElemInfo();
    }
    else
    {
        // for in-proc background JIT we need to explicitly copy LdLen, LdElem, and StElem info
        data->ldLenData = AnewArray(alloc, LdLenIDL, data->profiledLdLenCount);
        memcpy_s(
            data->ldLenData,
            data->profiledLdLenCount * sizeof(LdLenIDL),
            profileInfo->GetLdLenInfo(),
            functionBody->GetProfiledLdLenCount() * sizeof(Js::LdLenInfo)
        );

        data->ldElemData = AnewArray(alloc, LdElemIDL, data->profiledLdElemCount);
        memcpy_s(
            data->ldElemData,
            data->profiledLdElemCount * sizeof(LdElemIDL),
            profileInfo->GetLdElemInfo(),
            functionBody->GetProfiledLdElemCount() * sizeof(Js::LdElemInfo)
        );

        data->stElemData = AnewArray(alloc, StElemIDL, data->profiledStElemCount);
        memcpy_s(
            data->stElemData,
            data->profiledStElemCount * sizeof(StElemIDL),
            profileInfo->GetStElemInfo(),
            functionBody->GetProfiledStElemCount() * sizeof(Js::StElemInfo)
        );
    }

    CompileAssert(sizeof(ArrayCallSiteIDL) == sizeof(Js::ArrayCallSiteInfo));
    data->profiledArrayCallSiteCount = functionBody->GetProfiledArrayCallSiteCount();
    data->arrayCallSiteData = (ArrayCallSiteIDL*)profileInfo->GetArrayCallSiteInfo();
    data->arrayCallSiteDataAddr = (intptr_t)profileInfo->GetArrayCallSiteInfo();

    CompileAssert(sizeof(FldIDL) == sizeof(Js::FldInfo));
    data->inlineCacheCount = functionBody->GetProfiledFldCount();
    data->fldData = (FldIDL*)profileInfo->GetFldInfo();
    data->fldDataAddr = (intptr_t)profileInfo->GetFldInfo();

    CompileAssert(sizeof(ThisIDL) == sizeof(Js::ThisInfo));
    data->thisData = *reinterpret_cast<ThisIDL*>(&profileInfo->GetThisInfo());

    CompileAssert(sizeof(CallSiteIDL) == sizeof(Js::CallSiteInfo));
    data->profiledCallSiteCount = functionBody->GetProfiledCallSiteCount();
    data->callSiteData = reinterpret_cast<CallSiteIDL*>(profileInfo->GetCallSiteInfo());

    CompileAssert(sizeof(CallbackInfoIDL) == sizeof(Js::CallbackInfo));
    Js::CallbackInfoList * callbackInfoList = functionBody->GetCallbackInfoListWithLock();
    if (callbackInfoList == nullptr)
    {
        data->profiledCallbackCount = 0;
    }
    else
    {
        data->profiledCallbackCount = static_cast<Js::ProfileId>(callbackInfoList->Count());
        if (data->profiledCallbackCount > 0)
        {
            data->callbackData = AnewArrayZ(alloc, CallbackInfoIDL, data->profiledCallbackCount);
            Js::CallbackInfoList::Iterator iter = callbackInfoList->GetIterator();
            for (Js::ProfileId callbackInfoIndex = 0; callbackInfoIndex < data->profiledCallbackCount; ++callbackInfoIndex)
            {
                iter.Next();
                Js::CallbackInfo * info = iter.Data();
                memcpy_s(
                    &data->callbackData[callbackInfoIndex],
                    sizeof(CallbackInfoIDL),
                    info,
                    sizeof(Js::CallbackInfo)
                );
            }
        }
    }

    CompileAssert(sizeof(BVUnitIDL) == sizeof(BVUnit));
    data->loopFlags = (BVFixedIDL*)profileInfo->GetLoopFlags();

    CompileAssert(sizeof(ValueType) == sizeof(uint16));

    data->profiledSlotCount = functionBody->GetProfiledSlotCount();
    data->slotData = reinterpret_cast<uint16*>(profileInfo->GetSlotInfo());

    data->profiledReturnTypeCount = functionBody->GetProfiledReturnTypeCount();
    data->returnTypeData = reinterpret_cast<uint16*>(profileInfo->GetReturnTypeInfo());

    data->profiledDivOrRemCount = functionBody->GetProfiledDivOrRemCount();
    data->divideTypeInfo = reinterpret_cast<uint16*>(profileInfo->GetDivideTypeInfo());

    data->profiledSwitchCount = functionBody->GetProfiledSwitchCount();
    data->switchTypeInfo = reinterpret_cast<uint16*>(profileInfo->GetSwitchTypeInfo());

    data->profiledInParamsCount = functionBody->GetProfiledInParamsCount();
    data->parameterInfo = reinterpret_cast<uint16*>(profileInfo->GetParameterInfo());

    data->loopCount = functionBody->GetLoopCount();
    data->loopImplicitCallFlags = reinterpret_cast<byte*>(profileInfo->GetLoopImplicitCallFlags());

    data->implicitCallFlags = static_cast<byte>(profileInfo->GetImplicitCallFlags());

    data->flags = 0;
    data->flags |= profileInfo->IsAggressiveIntTypeSpecDisabled(false) ? Flags_disableAggressiveIntTypeSpec : 0;
    data->flags |= profileInfo->IsAggressiveIntTypeSpecDisabled(true) ? Flags_disableAggressiveIntTypeSpec_jitLoopBody : 0;
    data->flags |= profileInfo->IsAggressiveMulIntTypeSpecDisabled(false) ? Flags_disableAggressiveMulIntTypeSpec : 0;
    data->flags |= profileInfo->IsAggressiveMulIntTypeSpecDisabled(true) ? Flags_disableAggressiveMulIntTypeSpec_jitLoopBody : 0;
    data->flags |= profileInfo->IsDivIntTypeSpecDisabled(false) ? Flags_disableDivIntTypeSpec : 0;
    data->flags |= profileInfo->IsDivIntTypeSpecDisabled(true) ? Flags_disableDivIntTypeSpec_jitLoopBody : 0;
    data->flags |= profileInfo->IsLossyIntTypeSpecDisabled() ? Flags_disableLossyIntTypeSpec : 0;
    data->flags |= profileInfo->IsTrackCompoundedIntOverflowDisabled() ? Flags_disableTrackCompoundedIntOverflow : 0;
    data->flags |= profileInfo->IsFloatTypeSpecDisabled() ? Flags_disableFloatTypeSpec : 0;
    data->flags |= profileInfo->IsArrayCheckHoistDisabled(false) ? Flags_disableArrayCheckHoist : 0;
    data->flags |= profileInfo->IsArrayCheckHoistDisabled(true) ? Flags_disableArrayCheckHoist_jitLoopBody : 0;
    data->flags |= profileInfo->IsArrayMissingValueCheckHoistDisabled(false) ? Flags_disableArrayMissingValueCheckHoist : 0;
    data->flags |= profileInfo->IsArrayMissingValueCheckHoistDisabled(true) ? Flags_disableArrayMissingValueCheckHoist_jitLoopBody : 0;
    data->flags |= profileInfo->IsJsArraySegmentHoistDisabled(false) ? Flags_disableJsArraySegmentHoist : 0;
    data->flags |= profileInfo->IsJsArraySegmentHoistDisabled(true) ? Flags_disableJsArraySegmentHoist_jitLoopBody : 0;
    data->flags |= profileInfo->IsArrayLengthHoistDisabled(false) ? Flags_disableArrayLengthHoist : 0;
    data->flags |= profileInfo->IsArrayLengthHoistDisabled(true) ? Flags_disableArrayLengthHoist_jitLoopBody : 0;
    data->flags |= profileInfo->IsTypedArrayTypeSpecDisabled(false) ? Flags_disableTypedArrayTypeSpec : 0;
    data->flags |= profileInfo->IsTypedArrayTypeSpecDisabled(true) ? Flags_disableTypedArrayTypeSpec_jitLoopBody : 0;
    data->flags |= profileInfo->IsLdLenIntSpecDisabled() ? Flags_disableLdLenIntSpec : 0;
    data->flags |= profileInfo->IsBoundCheckHoistDisabled(false) ? Flags_disableBoundCheckHoist : 0;
    data->flags |= profileInfo->IsBoundCheckHoistDisabled(true) ? Flags_disableBoundCheckHoist_jitLoopBody : 0;
    data->flags |= profileInfo->IsLoopCountBasedBoundCheckHoistDisabled(false) ? Flags_disableLoopCountBasedBoundCheckHoist : 0;
    data->flags |= profileInfo->IsLoopCountBasedBoundCheckHoistDisabled(true) ? Flags_disableLoopCountBasedBoundCheckHoist_jitLoopBody : 0;
    data->flags |= profileInfo->IsFloorInliningDisabled() ? Flags_disableFloorInlining : 0;
    data->flags |= profileInfo->IsNoProfileBailoutsDisabled() ? Flags_disableNoProfileBailouts : 0;
    data->flags |= profileInfo->IsSwitchOptDisabled() ? Flags_disableSwitchOpt : 0;
    data->flags |= profileInfo->IsEquivalentObjTypeSpecDisabled() ? Flags_disableEquivalentObjTypeSpec : 0;
    data->flags |= profileInfo->IsObjTypeSpecDisabledInJitLoopBody() ? Flags_disableObjTypeSpec_jitLoopBody : 0;
    data->flags |= profileInfo->IsMemOpDisabled() ? Flags_disableMemOp : 0;
    data->flags |= profileInfo->IsCheckThisDisabled() ? Flags_disableCheckThis : 0;
    data->flags |= profileInfo->HasLdFldCallSiteInfo() ? Flags_hasLdFldCallSiteInfo : 0;
    data->flags |= profileInfo->IsStackArgOptDisabled() ? Flags_disableStackArgOpt : 0;
    data->flags |= profileInfo->IsLoopImplicitCallInfoDisabled() ? Flags_disableLoopImplicitCallInfo : 0;
    data->flags |= profileInfo->IsPowIntIntTypeSpecDisabled() ? Flags_disablePowIntIntTypeSpec : 0;
    data->flags |= profileInfo->IsTagCheckDisabled() ? Flags_disableTagCheck : 0;
    data->flags |= profileInfo->IsOptimizeTryFinallyDisabled() ? Flags_disableOptimizeTryFinally : 0;
    data->flags |= profileInfo->IsFieldPREDisabled() ? Flags_disableFieldPRE : 0;
}